

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_linear_resampler_process_pcm_frames
                    (ma_linear_resampler *pResampler,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_uint32 *pmVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ma_format mVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ma_uint64 mVar16;
  ulong uVar17;
  float *pfVar18;
  ma_lpf1 *pmVar19;
  ma_biquad_coefficient *pmVar20;
  ma_lpf2 *pmVar21;
  float *pfVar22;
  ma_uint32 mVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined2 uVar27;
  int iVar28;
  ma_uint64 mVar29;
  ma_int16 mVar30;
  int iVar31;
  ma_uint64 mVar32;
  ma_uint64 mVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  bool bVar37;
  float fVar38;
  float fVar39;
  ma_uint64 local_78;
  
  if (pResampler == (ma_linear_resampler *)0x0) {
    return MA_INVALID_ARGS;
  }
  mVar8 = (pResampler->config).format;
  if (mVar8 == ma_format_f32) {
    if ((pResampler->config).sampleRateOut < (pResampler->config).sampleRateIn) {
      if (pFrameCountIn == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountIn != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x97ee,
                      "ma_result ma_linear_resampler_process_pcm_frames_f32_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      if (pFrameCountOut == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountOut != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x97ef,
                      "ma_result ma_linear_resampler_process_pcm_frames_f32_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      mVar16 = *pFrameCountOut;
      if (mVar16 != 0) {
        uVar17 = *pFrameCountIn;
        mVar32 = 0;
        mVar29 = 0;
        do {
          bVar37 = pResampler->inTimeInt != 0;
          if (mVar29 < uVar17 && bVar37) {
            do {
              uVar26 = (ulong)(pResampler->config).channels;
              if (pFramesIn == (void *)0x0) {
                if (uVar26 != 0) {
                  uVar25 = 0;
                  do {
                    (pResampler->x0).f32[uVar25] = (pResampler->x1).f32[uVar25];
                    (pResampler->x1).f32[uVar25] = 0.0;
                    uVar25 = uVar25 + 1;
                  } while (uVar26 != uVar25);
                }
                pFramesIn = (void *)0x0;
              }
              else {
                if (uVar26 != 0) {
                  uVar25 = 0;
                  do {
                    (pResampler->x0).f32[uVar25] = (pResampler->x1).f32[uVar25];
                    (pResampler->x1).f32[uVar25] = *(float *)((long)pFramesIn + uVar25 * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar26 != uVar25);
                }
                pFramesIn = (void *)((long)pFramesIn + uVar26 * 4);
              }
              if ((pResampler->lpf).format != ma_format_f32) goto LAB_001a23fb;
              pfVar18 = (pResampler->x1).f32;
              if ((pResampler->lpf).lpf1Count != 0) {
                uVar26 = 0;
                do {
                  pmVar19 = (pResampler->lpf).pLPF1;
                  uVar9 = pmVar19[uVar26].channels;
                  fVar2 = pmVar19[uVar26].a.f32;
                  uVar25 = 0;
                  do {
                    pmVar20 = pmVar19[uVar26].pR1;
                    fVar38 = pfVar18[uVar25] * (1.0 - fVar2) + pmVar20[uVar25].f32 * fVar2;
                    pfVar18[uVar25] = fVar38;
                    pmVar20[uVar25].f32 = fVar38;
                    uVar25 = uVar25 + 1;
                  } while (uVar9 != uVar25);
                  uVar26 = uVar26 + 1;
                } while (uVar26 < (pResampler->lpf).lpf1Count);
              }
              if ((pResampler->lpf).lpf2Count != 0) {
                uVar26 = 0;
                do {
                  pmVar21 = (pResampler->lpf).pLPF2;
                  uVar9 = pmVar21[uVar26].bq.channels;
                  fVar2 = pmVar21[uVar26].bq.b0.f32;
                  fVar38 = pmVar21[uVar26].bq.b1.f32;
                  fVar3 = pmVar21[uVar26].bq.b2.f32;
                  fVar4 = pmVar21[uVar26].bq.a1.f32;
                  fVar5 = pmVar21[uVar26].bq.a2.f32;
                  uVar25 = 0;
                  do {
                    pmVar20 = pmVar21[uVar26].bq.pR1;
                    fVar6 = pfVar18[uVar25];
                    fVar39 = fVar2 * fVar6 + pmVar20[uVar25].f32;
                    fVar7 = pmVar21[uVar26].bq.pR2[uVar25].f32;
                    pfVar18[uVar25] = fVar39;
                    pmVar20[uVar25].f32 = fVar38 * fVar6 + fVar39 * -fVar4 + fVar7;
                    pmVar21[uVar26].bq.pR2[uVar25].f32 = fVar6 * fVar3 + fVar39 * -fVar5;
                    uVar25 = uVar25 + 1;
                  } while (uVar9 != uVar25);
                  uVar26 = uVar26 + 1;
                } while (uVar26 < (pResampler->lpf).lpf2Count);
              }
              mVar29 = mVar29 + 1;
              pmVar1 = &pResampler->inTimeInt;
              *pmVar1 = *pmVar1 - 1;
              bVar37 = *pmVar1 != 0;
            } while ((bVar37) && (mVar29 < uVar17));
          }
          mVar33 = mVar32;
          if (bVar37) break;
          if (pFramesOut == (void *)0x0) {
            pFramesOut = (void *)0x0;
          }
          else {
            uVar26 = (ulong)(pResampler->config).channels;
            uVar9 = pResampler->inTimeFrac;
            uVar24 = (pResampler->config).sampleRateOut;
            pfVar18 = (pResampler->x0).f32;
            pfVar22 = (pResampler->x1).f32;
            uVar25 = 0;
            do {
              *(float *)((long)pFramesOut + uVar25 * 4) =
                   (pfVar22[uVar25] - pfVar18[uVar25]) * ((float)uVar9 / (float)uVar24) +
                   pfVar18[uVar25];
              uVar25 = uVar25 + 1;
            } while (uVar26 != uVar25);
            pFramesOut = (void *)((long)pFramesOut + uVar26 * 4);
          }
          uVar9 = (pResampler->config).sampleRateOut;
          pResampler->inTimeInt = pResampler->inAdvanceInt;
          uVar24 = pResampler->inTimeFrac + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar24;
          if (uVar9 <= uVar24) {
            pResampler->inTimeFrac = uVar24 - uVar9;
            pResampler->inTimeInt = pResampler->inAdvanceInt + 1;
          }
          mVar32 = mVar32 + 1;
          mVar33 = mVar16;
        } while (mVar32 != mVar16);
        goto LAB_001a23c5;
      }
    }
    else {
      if (pFrameCountIn == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountIn != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x9838,
                      "ma_result ma_linear_resampler_process_pcm_frames_f32_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      if (pFrameCountOut == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountOut != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x9839,
                      "ma_result ma_linear_resampler_process_pcm_frames_f32_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      mVar16 = *pFrameCountOut;
      if (mVar16 != 0) {
        uVar17 = *pFrameCountIn;
        mVar32 = 0;
        mVar29 = 0;
        do {
          mVar23 = pResampler->inTimeInt;
          bVar37 = mVar23 != 0;
          if (mVar29 < uVar17 && bVar37) {
            uVar26 = (ulong)(pResampler->config).channels;
            do {
              if (pFramesIn == (void *)0x0) {
                if (uVar26 != 0) {
                  uVar25 = 0;
                  do {
                    (pResampler->x0).f32[uVar25] = (pResampler->x1).f32[uVar25];
                    (pResampler->x1).f32[uVar25] = 0.0;
                    uVar25 = uVar25 + 1;
                  } while (uVar26 != uVar25);
                }
                pFramesIn = (void *)0x0;
              }
              else {
                if (uVar26 != 0) {
                  uVar25 = 0;
                  do {
                    (pResampler->x0).f32[uVar25] = (pResampler->x1).f32[uVar25];
                    (pResampler->x1).f32[uVar25] = *(float *)((long)pFramesIn + uVar25 * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar26 != uVar25);
                }
                pFramesIn = (void *)((long)pFramesIn + uVar26 * 4);
              }
              mVar29 = mVar29 + 1;
              mVar23 = mVar23 - 1;
              bVar37 = mVar23 != 0;
            } while ((bVar37) && (mVar29 < uVar17));
            pResampler->inTimeInt = mVar23;
          }
          mVar33 = mVar32;
          if (bVar37) break;
          if (pFramesOut == (void *)0x0) {
            pFramesOut = (void *)0x0;
          }
          else {
            uVar9 = (pResampler->config).channels;
            uVar24 = pResampler->inTimeFrac;
            uVar15 = (pResampler->config).sampleRateOut;
            pfVar18 = (pResampler->x0).f32;
            pfVar22 = (pResampler->x1).f32;
            uVar26 = 0;
            do {
              *(float *)((long)pFramesOut + uVar26 * 4) =
                   (pfVar22[uVar26] - pfVar18[uVar26]) * ((float)uVar24 / (float)uVar15) +
                   pfVar18[uVar26];
              uVar26 = uVar26 + 1;
            } while (uVar9 != uVar26);
            if ((pResampler->lpf).format != ma_format_f32) {
LAB_001a23fb:
              __assert_fail("pLPF->format == ma_format_f32",
                            "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                            ,0x84e1,
                            "void ma_lpf_process_pcm_frame_f32(ma_lpf *, float *, const void *)");
            }
            if ((pResampler->lpf).lpf1Count != 0) {
              uVar26 = 0;
              do {
                pmVar19 = (pResampler->lpf).pLPF1;
                uVar9 = pmVar19[uVar26].channels;
                fVar2 = pmVar19[uVar26].a.f32;
                uVar25 = 0;
                do {
                  pmVar20 = pmVar19[uVar26].pR1;
                  fVar38 = *(float *)((long)pFramesOut + uVar25 * 4) * (1.0 - fVar2) +
                           pmVar20[uVar25].f32 * fVar2;
                  *(float *)((long)pFramesOut + uVar25 * 4) = fVar38;
                  pmVar20[uVar25].f32 = fVar38;
                  uVar25 = uVar25 + 1;
                } while (uVar9 != uVar25);
                uVar26 = uVar26 + 1;
              } while (uVar26 < (pResampler->lpf).lpf1Count);
            }
            if ((pResampler->lpf).lpf2Count != 0) {
              uVar26 = 0;
              do {
                pmVar21 = (pResampler->lpf).pLPF2;
                uVar9 = pmVar21[uVar26].bq.channels;
                fVar2 = pmVar21[uVar26].bq.b0.f32;
                fVar38 = pmVar21[uVar26].bq.b1.f32;
                fVar3 = pmVar21[uVar26].bq.b2.f32;
                fVar4 = pmVar21[uVar26].bq.a1.f32;
                fVar5 = pmVar21[uVar26].bq.a2.f32;
                uVar25 = 0;
                do {
                  pmVar20 = pmVar21[uVar26].bq.pR1;
                  fVar6 = *(float *)((long)pFramesOut + uVar25 * 4);
                  fVar39 = fVar2 * fVar6 + pmVar20[uVar25].f32;
                  fVar7 = pmVar21[uVar26].bq.pR2[uVar25].f32;
                  *(float *)((long)pFramesOut + uVar25 * 4) = fVar39;
                  pmVar20[uVar25].f32 = fVar38 * fVar6 + fVar39 * -fVar4 + fVar7;
                  pmVar21[uVar26].bq.pR2[uVar25].f32 = fVar6 * fVar3 + fVar39 * -fVar5;
                  uVar25 = uVar25 + 1;
                } while (uVar9 != uVar25);
                uVar26 = uVar26 + 1;
              } while (uVar26 < (pResampler->lpf).lpf2Count);
            }
            pFramesOut = (void *)((long)pFramesOut + (ulong)(pResampler->config).channels * 4);
          }
          uVar9 = (pResampler->config).sampleRateOut;
          mVar23 = pResampler->inTimeInt + pResampler->inAdvanceInt;
          pResampler->inTimeInt = mVar23;
          uVar24 = pResampler->inTimeFrac + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar24;
          if (uVar9 <= uVar24) {
            pResampler->inTimeFrac = uVar24 - uVar9;
            pResampler->inTimeInt = mVar23 + 1;
          }
          mVar32 = mVar32 + 1;
          mVar33 = mVar16;
        } while (mVar32 != mVar16);
        goto LAB_001a23c5;
      }
    }
  }
  else {
    if (mVar8 != ma_format_s16) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                    ,0x9890,
                    "ma_result ma_linear_resampler_process_pcm_frames(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                   );
    }
    if ((pResampler->config).sampleRateOut < (pResampler->config).sampleRateIn) {
      if (pFrameCountIn == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountIn != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x974e,
                      "ma_result ma_linear_resampler_process_pcm_frames_s16_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      if (pFrameCountOut == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountOut != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x974f,
                      "ma_result ma_linear_resampler_process_pcm_frames_s16_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      mVar16 = *pFrameCountOut;
      if (mVar16 != 0) {
        uVar17 = *pFrameCountIn;
        local_78 = 0;
        mVar29 = 0;
        do {
          bVar37 = pResampler->inTimeInt != 0;
          if (mVar29 < uVar17 && bVar37) {
            do {
              uVar26 = (ulong)(pResampler->config).channels;
              if (pFramesIn == (void *)0x0) {
                if (uVar26 != 0) {
                  uVar25 = 0;
                  do {
                    *(undefined2 *)((long)(pResampler->x0).f32 + uVar25 * 2) =
                         *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2);
                    *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2) = 0;
                    uVar25 = uVar25 + 1;
                  } while (uVar26 != uVar25);
                }
                pFramesIn = (void *)0x0;
              }
              else {
                if (uVar26 != 0) {
                  uVar25 = 0;
                  do {
                    *(undefined2 *)((long)(pResampler->x0).f32 + uVar25 * 2) =
                         *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2);
                    *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2) =
                         *(undefined2 *)((long)pFramesIn + uVar25 * 2);
                    uVar25 = uVar25 + 1;
                  } while (uVar26 != uVar25);
                }
                pFramesIn = (void *)((long)pFramesIn + uVar26 * 2);
              }
              if ((pResampler->lpf).format != ma_format_s16) goto LAB_001a23dc;
              pfVar18 = (pResampler->x1).f32;
              if ((pResampler->lpf).lpf1Count != 0) {
                uVar26 = 0;
                do {
                  pmVar19 = (pResampler->lpf).pLPF1;
                  uVar9 = pmVar19[uVar26].channels;
                  iVar10 = pmVar19[uVar26].a.s32;
                  uVar25 = 0;
                  do {
                    pmVar20 = pmVar19[uVar26].pR1;
                    iVar34 = pmVar20[uVar25].s32 * iVar10 +
                             (int)*(short *)((long)pfVar18 + uVar25 * 2) * (0x4000 - iVar10) >> 0xe;
                    *(short *)((long)pfVar18 + uVar25 * 2) = (short)iVar34;
                    pmVar20[uVar25].s32 = iVar34;
                    uVar25 = uVar25 + 1;
                  } while (uVar9 != uVar25);
                  uVar26 = uVar26 + 1;
                } while (uVar26 < (pResampler->lpf).lpf1Count);
              }
              if ((pResampler->lpf).lpf2Count != 0) {
                uVar26 = 0;
                do {
                  pmVar21 = (pResampler->lpf).pLPF2;
                  uVar9 = pmVar21[uVar26].bq.channels;
                  iVar10 = pmVar21[uVar26].bq.b0.s32;
                  iVar34 = pmVar21[uVar26].bq.b1.s32;
                  iVar11 = pmVar21[uVar26].bq.b2.s32;
                  iVar12 = pmVar21[uVar26].bq.a1.s32;
                  iVar13 = pmVar21[uVar26].bq.a2.s32;
                  uVar25 = 0;
                  do {
                    pmVar20 = pmVar21[uVar26].bq.pR1;
                    iVar31 = (int)*(short *)((long)pfVar18 + uVar25 * 2);
                    iVar14 = pmVar21[uVar26].bq.pR2[uVar25].s32;
                    iVar28 = iVar10 * iVar31 + pmVar20[uVar25].s32 >> 0xe;
                    iVar35 = iVar12 * iVar28;
                    iVar36 = iVar28 * iVar13;
                    if (0x7ffe < iVar28) {
                      iVar28 = 0x7fff;
                    }
                    uVar27 = (undefined2)iVar28;
                    if (iVar28 < -0x7fff) {
                      uVar27 = 0x8000;
                    }
                    *(undefined2 *)((long)pfVar18 + uVar25 * 2) = uVar27;
                    pmVar20[uVar25].s32 = (iVar34 * iVar31 + iVar14) - iVar35;
                    pmVar21[uVar26].bq.pR2[uVar25].s32 = iVar31 * iVar11 - iVar36;
                    uVar25 = uVar25 + 1;
                  } while (uVar9 != uVar25);
                  uVar26 = uVar26 + 1;
                } while (uVar26 < (pResampler->lpf).lpf2Count);
              }
              mVar29 = mVar29 + 1;
              pmVar1 = &pResampler->inTimeInt;
              *pmVar1 = *pmVar1 - 1;
              bVar37 = *pmVar1 != 0;
            } while ((bVar37) && (mVar29 < uVar17));
          }
          mVar33 = local_78;
          if (bVar37) break;
          if ((ma_int16 *)pFramesOut == (ma_int16 *)0x0) {
            pFramesOut = (ma_int16 *)0x0;
          }
          else {
            ma_linear_resampler_interpolate_frame_s16(pResampler,(ma_int16 *)pFramesOut);
            pFramesOut = (void *)((long)pFramesOut + (ulong)(pResampler->config).channels * 2);
          }
          uVar9 = (pResampler->config).sampleRateOut;
          mVar23 = pResampler->inTimeInt + pResampler->inAdvanceInt;
          pResampler->inTimeInt = mVar23;
          uVar24 = pResampler->inTimeFrac + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar24;
          if (uVar9 <= uVar24) {
            pResampler->inTimeFrac = uVar24 - uVar9;
            pResampler->inTimeInt = mVar23 + 1;
          }
          local_78 = local_78 + 1;
          mVar33 = mVar16;
        } while (local_78 != mVar16);
        goto LAB_001a23c5;
      }
    }
    else {
      if (pFrameCountIn == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountIn != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x9798,
                      "ma_result ma_linear_resampler_process_pcm_frames_s16_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      if (pFrameCountOut == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountOut != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x9799,
                      "ma_result ma_linear_resampler_process_pcm_frames_s16_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      mVar16 = *pFrameCountOut;
      if (mVar16 != 0) {
        uVar17 = *pFrameCountIn;
        local_78 = 0;
        mVar29 = 0;
        do {
          mVar23 = pResampler->inTimeInt;
          bVar37 = mVar23 != 0;
          if (mVar29 < uVar17 && bVar37) {
            uVar26 = (ulong)(pResampler->config).channels;
            do {
              if (pFramesIn == (void *)0x0) {
                if (uVar26 != 0) {
                  uVar25 = 0;
                  do {
                    *(undefined2 *)((long)(pResampler->x0).f32 + uVar25 * 2) =
                         *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2);
                    *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2) = 0;
                    uVar25 = uVar25 + 1;
                  } while (uVar26 != uVar25);
                }
                pFramesIn = (void *)0x0;
              }
              else {
                if (uVar26 != 0) {
                  uVar25 = 0;
                  do {
                    *(undefined2 *)((long)(pResampler->x0).f32 + uVar25 * 2) =
                         *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2);
                    *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2) =
                         *(undefined2 *)((long)pFramesIn + uVar25 * 2);
                    uVar25 = uVar25 + 1;
                  } while (uVar26 != uVar25);
                }
                pFramesIn = (void *)((long)pFramesIn + uVar26 * 2);
              }
              mVar29 = mVar29 + 1;
              mVar23 = mVar23 - 1;
              bVar37 = mVar23 != 0;
            } while ((bVar37) && (mVar29 < uVar17));
            pResampler->inTimeInt = mVar23;
          }
          mVar33 = local_78;
          if (bVar37) break;
          if ((ma_int16 *)pFramesOut == (ma_int16 *)0x0) {
            pFramesOut = (ma_int16 *)0x0;
          }
          else {
            ma_linear_resampler_interpolate_frame_s16(pResampler,(ma_int16 *)pFramesOut);
            if ((pResampler->lpf).format != ma_format_s16) {
LAB_001a23dc:
              __assert_fail("pLPF->format == ma_format_s16",
                            "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                            ,0x84f3,
                            "void ma_lpf_process_pcm_frame_s16(ma_lpf *, ma_int16 *, const ma_int16 *)"
                           );
            }
            if ((pResampler->lpf).lpf1Count != 0) {
              uVar26 = 0;
              do {
                pmVar19 = (pResampler->lpf).pLPF1;
                uVar9 = pmVar19[uVar26].channels;
                iVar10 = pmVar19[uVar26].a.s32;
                uVar25 = 0;
                do {
                  pmVar20 = pmVar19[uVar26].pR1;
                  iVar34 = pmVar20[uVar25].s32 * iVar10 +
                           (int)*(short *)((long)pFramesOut + uVar25 * 2) * (0x4000 - iVar10) >> 0xe
                  ;
                  *(ma_int16 *)((long)pFramesOut + uVar25 * 2) = (ma_int16)iVar34;
                  pmVar20[uVar25].s32 = iVar34;
                  uVar25 = uVar25 + 1;
                } while (uVar9 != uVar25);
                uVar26 = uVar26 + 1;
              } while (uVar26 < (pResampler->lpf).lpf1Count);
            }
            if ((pResampler->lpf).lpf2Count != 0) {
              uVar26 = 0;
              do {
                pmVar21 = (pResampler->lpf).pLPF2;
                uVar9 = pmVar21[uVar26].bq.channels;
                iVar10 = pmVar21[uVar26].bq.b0.s32;
                iVar34 = pmVar21[uVar26].bq.b1.s32;
                iVar11 = pmVar21[uVar26].bq.b2.s32;
                iVar12 = pmVar21[uVar26].bq.a1.s32;
                iVar13 = pmVar21[uVar26].bq.a2.s32;
                uVar25 = 0;
                do {
                  pmVar20 = pmVar21[uVar26].bq.pR1;
                  iVar28 = (int)*(short *)((long)pFramesOut + uVar25 * 2);
                  iVar14 = pmVar21[uVar26].bq.pR2[uVar25].s32;
                  iVar31 = iVar10 * iVar28 + pmVar20[uVar25].s32 >> 0xe;
                  iVar35 = iVar12 * iVar31;
                  iVar36 = iVar31 * iVar13;
                  if (0x7ffe < iVar31) {
                    iVar31 = 0x7fff;
                  }
                  mVar30 = (ma_int16)iVar31;
                  if (iVar31 < -0x7fff) {
                    mVar30 = -0x8000;
                  }
                  *(ma_int16 *)((long)pFramesOut + uVar25 * 2) = mVar30;
                  pmVar20[uVar25].s32 = (iVar34 * iVar28 + iVar14) - iVar35;
                  pmVar21[uVar26].bq.pR2[uVar25].s32 = iVar28 * iVar11 - iVar36;
                  uVar25 = uVar25 + 1;
                } while (uVar9 != uVar25);
                uVar26 = uVar26 + 1;
              } while (uVar26 < (pResampler->lpf).lpf2Count);
            }
            pFramesOut = (void *)((long)pFramesOut + (ulong)(pResampler->config).channels * 2);
          }
          uVar9 = (pResampler->config).sampleRateOut;
          mVar23 = pResampler->inTimeInt + pResampler->inAdvanceInt;
          pResampler->inTimeInt = mVar23;
          uVar24 = pResampler->inTimeFrac + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar24;
          if (uVar9 <= uVar24) {
            pResampler->inTimeFrac = uVar24 - uVar9;
            pResampler->inTimeInt = mVar23 + 1;
          }
          local_78 = local_78 + 1;
          mVar33 = mVar16;
        } while (local_78 != mVar16);
        goto LAB_001a23c5;
      }
    }
  }
  mVar29 = 0;
  mVar33 = 0;
LAB_001a23c5:
  *pFrameCountIn = mVar29;
  *pFrameCountOut = mVar33;
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_linear_resampler_process_pcm_frames(ma_linear_resampler* pResampler, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    /*  */ if (pResampler->config.format == ma_format_s16) {
        return ma_linear_resampler_process_pcm_frames_s16(pResampler, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
    } else if (pResampler->config.format == ma_format_f32) {
        return ma_linear_resampler_process_pcm_frames_f32(pResampler, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
    } else {
        /* Should never get here. Getting here means the format is not supported and you didn't check the return value of ma_linear_resampler_init(). */
        MA_ASSERT(MA_FALSE);
        return MA_INVALID_ARGS;
    }
}